

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

Float __thiscall
pbrt::WindowedPiecewiseConstant2D::Eval(WindowedPiecewiseConstant2D *this,Point2f *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->func).extent.pMax.super_Tuple2<pbrt::Point2,_int>;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->func).extent.pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar2 = vpsubd_avx(auVar4,auVar5);
  auVar4 = vcvtdq2ps_avx(auVar2);
  auVar1 = vpcmpeqd_avx(auVar4,auVar4);
  auVar1 = vpaddd_avx(auVar2,auVar1);
  auVar3._0_4_ = (int)((p->super_Tuple2<pbrt::Point2,_float>).x * auVar4._0_4_);
  auVar3._4_4_ = (int)((p->super_Tuple2<pbrt::Point2,_float>).y * auVar4._4_4_);
  auVar3._8_4_ = (int)(auVar4._8_4_ * 0.0);
  auVar3._12_4_ = (int)(auVar4._12_4_ * 0.0);
  auVar4 = vpminsd_avx(auVar1,auVar3);
  auVar1 = vpsubd_avx(auVar4,auVar5);
  auVar4 = vpshufd_avx(auVar1,0x55);
  auVar4 = vpmulld_avx(auVar4,auVar2);
  auVar4 = vpaddd_avx(auVar1,auVar4);
  return (this->func).values[auVar4._0_4_];
}

Assistant:

PBRT_CPU_GPU
    int xSize() const { return extent.pMax.x - extent.pMin.x; }